

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall
basisu::vector<basisu::vector<unsigned_char>_>::~vector
          (vector<basisu::vector<unsigned_char>_> *this)

{
  vector<unsigned_char> *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  if (in_RDI->m_p != (uchar *)0x0) {
    scalar_type<basisu::vector<unsigned_char>_>::destruct_array(in_RDI,in_stack_ffffffffffffffe8);
    free(in_RDI->m_p);
  }
  return;
}

Assistant:

inline ~vector()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
         }
      }